

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O0

int rtp_rfc3119_pkt_unpack(rtp_pkt_t *pkt)

{
  unsigned_short length;
  uchar *ptr;
  rtp_pkt_t *pkt_local;
  
  if (((uint)pkt->b >> 9 & 0x7f) == 0x60) {
    *(byte *)&pkt->rfc3119_b =
         *(byte *)&pkt->rfc3119_b & 0xfe | (byte)((int)(uint)pkt->data[(ulong)pkt->hlen - 1] >> 7);
    *(byte *)&pkt->rfc3119_b =
         *(byte *)&pkt->rfc3119_b & 0xfd |
         ((byte)((int)(uint)pkt->data[(ulong)pkt->hlen - 1] >> 6) & 1) << 1;
    if ((*(byte *)&pkt->rfc3119_b >> 1 & 1) != 0) {
      pkt->length = pkt->length - 1;
    }
    pkt_local._4_4_ = 1;
  }
  else {
    pkt_local._4_4_ = 0;
  }
  return pkt_local._4_4_;
}

Assistant:

int rtp_rfc3119_pkt_unpack(rtp_pkt_t *pkt) {
  if (pkt->b.pt != RTP_DYN)
    return 0;

  unsigned char *ptr = pkt->data + pkt->hlen - 1;
  pkt->rfc3119_b.c = (*ptr >> 7) & 1;
  assert((pkt->rfc3119_b.c == 0) || "Continuation is not handled yet");
  pkt->rfc3119_b.t = (*ptr >> 6) & 1;

  unsigned short length;
  if (pkt->rfc3119_b.t) {
    length = (*(ptr++) & 0x3F) << 8;
    length |= (*ptr & 0xFF);
    pkt->length--;
  } else {
    length = (*ptr & 0x3F);
  }
  
  assert((pkt->length == length) || "error while decoding RFC3119 length");
  
  return 1;
}